

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O2

void __thiscall ON_AerialPhotoImageFrustum::Unset(ON_AerialPhotoImageFrustum *this)

{
  double dVar1;
  
  this->m_height = -1.23432101234321e+308;
  dVar1 = ON_2dPoint::UnsetPoint.y;
  this->m_corners[0].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[0].y = dVar1;
  dVar1 = ON_2dPoint::UnsetPoint.y;
  this->m_corners[1].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[1].y = dVar1;
  dVar1 = ON_2dPoint::UnsetPoint.y;
  this->m_corners[2].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[2].y = dVar1;
  dVar1 = ON_2dPoint::UnsetPoint.y;
  this->m_corners[3].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[3].y = dVar1;
  ON_UnitSystem::operator=(&this->m_unit_system,&ON_UnitSystem::None);
  return;
}

Assistant:

void ON_AerialPhotoImageFrustum::Unset()
{
  m_height = ON_UNSET_VALUE;
  m_corners[0] = ON_2dPoint::UnsetPoint;
  m_corners[1] = ON_2dPoint::UnsetPoint;
  m_corners[2] = ON_2dPoint::UnsetPoint;
  m_corners[3] = ON_2dPoint::UnsetPoint;
  m_unit_system = ON_UnitSystem::None;
}